

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall Assimp::FBX::LayeredTexture::fillTexture(LayeredTexture *this,Document *doc)

{
  const_reference ppCVar1;
  Object *pOVar2;
  ulong __n;
  Texture *tex;
  allocator<char> local_69;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_68;
  string local_50;
  
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_68,doc,(this->super_Object).id);
  for (__n = 0; __n < (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3);
      __n = __n + 1) {
    ppCVar1 = std::
              vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ::at((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)&local_68,__n);
    pOVar2 = Connection::SourceObject(*ppCVar1);
    if (pOVar2 == (Object *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"failed to read source object for texture link, ignoring",
                 &local_69);
      Util::DOMWarning(&local_50,(this->super_Object).element);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p =
           (pointer)__dynamic_cast(pOVar2,&Object::typeinfo,&FBX::Texture::typeinfo,0);
      std::vector<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>::
      push_back(&this->textures,(value_type *)&local_50);
    }
  }
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base(&local_68);
  return;
}

Assistant:

void LayeredTexture::fillTexture(const Document& doc)
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(size_t i = 0; i < conns.size();++i)
    {
        const Connection* con = conns.at(i);

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);

        textures.push_back(tex);
    }
}